

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_access(char *filename)

{
  FILE *__stream;
  FILE *diskfile;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    fclose(__stream);
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

int fp_access (char *filename)
{
	/* test if a file exists */
	
	FILE *diskfile;
	
	diskfile = fopen(filename, "r");

	if (diskfile) {
		fclose(diskfile);
		return(0);
	} else {
	        return(-1);
	}
}